

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRangeList.cpp
# Opt level: O1

DWARFAddressRangesVector * __thiscall
llvm::DWARFDebugRangeList::getAbsoluteRanges
          (DWARFAddressRangesVector *__return_storage_ptr__,DWARFDebugRangeList *this,
          Optional<llvm::object::SectionedAddress> BaseAddr)

{
  pointer *ppDVar1;
  pointer pRVar2;
  iterator __position;
  bool bVar3;
  pointer this_00;
  undefined1 auStack_58 [8];
  DWARFAddressRange E;
  uint64_t local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->Entries).
            super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (this->Entries).
           super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  E.SectionIndex = BaseAddr.Storage.field_0.value.Address;
  if (this_00 != pRVar2) {
    local_38 = BaseAddr.Storage.field_0.value.SectionIndex;
    do {
      bVar3 = RangeListEntry::isBaseAddressSelectionEntry(this_00,this->AddressSize);
      if (bVar3) {
        E.SectionIndex = this_00->EndAddress;
        local_38 = this_00->SectionIndex;
        if ((BaseAddr.Storage.hasVal & 1U) == 0) {
          BaseAddr.Storage.hasVal = true;
        }
      }
      else {
        auStack_58 = (undefined1  [8])this_00->StartAddress;
        E.LowPC = this_00->EndAddress;
        E.HighPC = this_00->SectionIndex;
        if ((BaseAddr.Storage.hasVal & 1U) != 0) {
          auStack_58 = (undefined1  [8])((long)auStack_58 + E.SectionIndex);
          E.LowPC = E.LowPC + E.SectionIndex;
          if (E.HighPC == 0xffffffffffffffff) {
            E.HighPC = local_38;
          }
        }
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>::
          _M_realloc_insert<llvm::DWARFAddressRange_const&>
                    ((vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>> *)
                     __return_storage_ptr__,__position,(DWARFAddressRange *)auStack_58);
        }
        else {
          (__position._M_current)->SectionIndex = E.HighPC;
          (__position._M_current)->LowPC = (uint64_t)auStack_58;
          (__position._M_current)->HighPC = E.LowPC;
          ppDVar1 = &(__return_storage_ptr__->
                     super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 != pRVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

DWARFAddressRangesVector DWARFDebugRangeList::getAbsoluteRanges(
    llvm::Optional<object::SectionedAddress> BaseAddr) const {
  DWARFAddressRangesVector Res;
  for (const RangeListEntry &RLE : Entries) {
    if (RLE.isBaseAddressSelectionEntry(AddressSize)) {
      BaseAddr = {RLE.EndAddress, RLE.SectionIndex};
      continue;
    }

    DWARFAddressRange E;
    E.LowPC = RLE.StartAddress;
    E.HighPC = RLE.EndAddress;
    E.SectionIndex = RLE.SectionIndex;
    // Base address of a range list entry is determined by the closest preceding
    // base address selection entry in the same range list. It defaults to the
    // base address of the compilation unit if there is no such entry.
    if (BaseAddr) {
      E.LowPC += BaseAddr->Address;
      E.HighPC += BaseAddr->Address;
      if (E.SectionIndex == -1ULL)
        E.SectionIndex = BaseAddr->SectionIndex;
    }
    Res.push_back(E);
  }
  return Res;
}